

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

uint GetNgonBoundarySegments
               (ON_MeshFaceList *face_list,uint ngon_fi_count,uint *ngon_fi,uint ngon_boundary_index
               ,NgonNeighbors *ngon_nbr_map,ON_SimpleArray<unsigned_int> *ngon_vi,
               ON_SimpleArray<unsigned_int> *ngon_side)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  ON__UINT_PTR OVar6;
  uint ngon_boundary_index0;
  uint max_face_visit_count;
  uint face_vist_count;
  uint nbr_ngon_fdex;
  uint ngon_fdex;
  uint max_vertex_count;
  uint fi;
  uint vi1;
  uint vi0;
  uint Fvi [4];
  uint local_4c;
  uint j1;
  uint next_j0;
  uint j0;
  ON_SimpleArray<unsigned_int> *ngon_vi_local;
  NgonNeighbors *ngon_nbr_map_local;
  uint ngon_boundary_index_local;
  uint *ngon_fi_local;
  uint ngon_fi_count_local;
  ON_MeshFaceList *face_list_local;
  
  if (((ngon_fi_count == 0) || (ngon_fi == (uint *)0x0)) || (ngon_nbr_map == (NgonNeighbors *)0x0))
  {
    face_list_local._4_4_ = 0;
  }
  else if (ngon_fi_count == 1) {
    if ((((ngon_nbr_map->m_NFS[0] == 0) && (ngon_nbr_map->m_NFS[1] == 0)) &&
        (ngon_nbr_map->m_NFS[2] == 0)) && (ngon_nbr_map->m_NFS[3] == 0)) {
      ON_MeshFaceList::QuadFvi(face_list,*ngon_fi,&vi1);
      if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
        ON_SimpleArray<unsigned_int>::Append(ngon_vi,&vi1);
      }
      if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
        uVar2 = EncodeNgonSide(0,0,0);
        puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
        *puVar5 = uVar2;
      }
      OVar6 = EncodeNFS_BoundaryIndex((ulong)ngon_boundary_index);
      ngon_nbr_map->m_NFS[0] = OVar6;
      if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
        ON_SimpleArray<unsigned_int>::Append(ngon_vi,&vi0);
      }
      if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
        uVar2 = EncodeNgonSide(0,1,0);
        puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
        *puVar5 = uVar2;
      }
      OVar6 = EncodeNFS_BoundaryIndex((ulong)(ngon_boundary_index + 1));
      ngon_nbr_map->m_NFS[1] = OVar6;
      ngon_nbr_map_local._4_4_ = ngon_boundary_index + 2;
      if (Fvi[0] != Fvi[1]) {
        if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
          ON_SimpleArray<unsigned_int>::Append(ngon_vi,Fvi);
        }
        if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
          uVar2 = EncodeNgonSide(0,2,0);
          puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
          *puVar5 = uVar2;
        }
        ngon_nbr_map_local._4_4_ = ngon_boundary_index + 3;
        OVar6 = EncodeNFS_BoundaryIndex((ulong)(ngon_boundary_index + 2));
        ngon_nbr_map->m_NFS[2] = OVar6;
      }
      if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
        ON_SimpleArray<unsigned_int>::Append(ngon_vi,Fvi + 1);
      }
      if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
        uVar2 = EncodeNgonSide(0,3,0);
        puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
        *puVar5 = uVar2;
      }
      OVar6 = EncodeNFS_BoundaryIndex((ulong)ngon_nbr_map_local._4_4_);
      ngon_nbr_map->m_NFS[3] = OVar6;
      face_list_local._4_4_ = (ngon_nbr_map_local._4_4_ + 1) - ngon_boundary_index;
    }
    else {
      face_list_local._4_4_ = 0;
    }
  }
  else {
    j1 = 0;
    for (face_vist_count = 0; face_vist_count < ngon_fi_count; face_vist_count = face_vist_count + 1
        ) {
      ON_MeshFaceList::QuadFvi(face_list,ngon_fi[face_vist_count],&vi1);
      for (j1 = 0; (j1 < 4 &&
                   (((&vi1)[j1] == (&vi1)[j1 + 1 & 3] ||
                    (ngon_nbr_map[face_vist_count].m_NFS[j1] != 0)))); j1 = j1 + 1) {
      }
      if (j1 < 4) break;
    }
    if (face_vist_count < ngon_fi_count) {
      ngon_nbr_map_local._4_4_ = ngon_boundary_index + 1;
      OVar6 = EncodeNFS_BoundaryIndex((ulong)ngon_boundary_index);
      ngon_nbr_map[face_vist_count].m_NFS[j1] = OVar6;
      if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
        uVar2 = EncodeNgonSide(face_vist_count,j1,0);
        puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
        *puVar5 = uVar2;
      }
      fi = (&vi1)[j1];
      j1 = j1 + 1 & 3;
      max_vertex_count = (&vi1)[j1];
      if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
        ON_SimpleArray<unsigned_int>::Append(ngon_vi,&fi);
        ON_SimpleArray<unsigned_int>::Append(ngon_vi,&max_vertex_count);
      }
      for (ngon_boundary_index0 = 0;
          ngon_boundary_index0 <= ngon_fi_count * 2 - 1 &&
          ngon_nbr_map_local._4_4_ - ngon_boundary_index <= ngon_fi_count * 2 + 2;
          ngon_boundary_index0 = ngon_boundary_index0 + 1) {
        local_4c = 0;
        while ((local_4c < 4 && (ngon_nbr_map[face_vist_count].m_NFS[j1] == 0))) {
          uVar2 = j1 + 1 & 3;
          if (max_vertex_count != (&vi1)[uVar2]) {
            uVar4 = ngon_nbr_map_local._4_4_ + 1;
            OVar6 = EncodeNFS_BoundaryIndex((ulong)ngon_nbr_map_local._4_4_);
            ngon_nbr_map[face_vist_count].m_NFS[j1] = OVar6;
            if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
              uVar3 = EncodeNgonSide(face_vist_count,j1,0);
              puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
              *puVar5 = uVar3;
            }
            max_vertex_count = (&vi1)[uVar2];
            if (fi == max_vertex_count) {
              if (2 < uVar4 - ngon_boundary_index) {
                return uVar4 - ngon_boundary_index;
              }
              return 0;
            }
            ngon_nbr_map_local._4_4_ = uVar4;
            if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
              ON_SimpleArray<unsigned_int>::Append(ngon_vi,&max_vertex_count);
            }
          }
          local_4c = local_4c + 1;
          j1 = uVar2;
        }
        if ((3 < local_4c) ||
           (bVar1 = IsNFS_Neighbor(ngon_nbr_map[face_vist_count].m_NFS[j1]), !bVar1)) break;
        OVar6 = DecodeNFS_NgonFaceIndex(ngon_nbr_map[face_vist_count].m_NFS[j1]);
        uVar2 = (uint)OVar6;
        if ((uVar2 == face_vist_count) || (ngon_fi_count <= uVar2)) break;
        uVar4 = DecodeNFS_EdgeIndex(ngon_nbr_map[face_vist_count].m_NFS[j1]);
        ON_MeshFaceList::QuadFvi(face_list,ngon_fi[OVar6 & 0xffffffff],&vi1);
        j1 = uVar4 + 1 & 3;
        if (max_vertex_count != (&vi1)[j1]) break;
        face_vist_count = uVar2;
      }
      face_list_local._4_4_ = 0;
    }
    else {
      face_list_local._4_4_ = 0;
    }
  }
  return face_list_local._4_4_;
}

Assistant:

static unsigned int GetNgonBoundarySegments(
  const ON_MeshFaceList& face_list,
  unsigned int ngon_fi_count,
  const unsigned int* ngon_fi,
  unsigned int ngon_boundary_index,
  struct NgonNeighbors* ngon_nbr_map,
  ON_SimpleArray<unsigned int>* ngon_vi,
  ON_SimpleArray<unsigned int>* ngon_side
  )
{
  unsigned int j0, next_j0, j1;
  unsigned int Fvi[4];
  unsigned int vi0, vi1, fi, max_vertex_count;
  unsigned int ngon_fdex, nbr_ngon_fdex, face_vist_count, max_face_visit_count;

  const unsigned int ngon_boundary_index0 = ngon_boundary_index;

  if ( ngon_fi_count <= 0 || 0 == ngon_fi || 0 == ngon_nbr_map )
    return 0;

  if ( 1 == ngon_fi_count )
  {
    if (    0 != ngon_nbr_map[0].m_NFS[0] 
         || 0 != ngon_nbr_map[0].m_NFS[1] 
         || 0 != ngon_nbr_map[0].m_NFS[2] 
         || 0 != ngon_nbr_map[0].m_NFS[3] 
         )
    {
      return 0;
    }
    face_list.QuadFvi(ngon_fi[0],Fvi);

    if ( ngon_vi )
      ngon_vi->Append(Fvi[0]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,0,false);
    ngon_nbr_map[0].m_NFS[0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    if ( ngon_vi )
      ngon_vi->Append(Fvi[1]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,1,false);
    ngon_nbr_map[0].m_NFS[1] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    if ( Fvi[2] != Fvi[3] )
    {
      if ( ngon_vi )
        ngon_vi->Append(Fvi[2]);
      if ( ngon_side )
        ngon_side->AppendNew() = EncodeNgonSide(0,2,false);
      ngon_nbr_map[0].m_NFS[2] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
    }

    if ( ngon_vi )
      ngon_vi->Append(Fvi[3]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,3,false);
    ngon_nbr_map[0].m_NFS[3] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    return ngon_boundary_index - ngon_boundary_index0;
  }


  fi = 0;  // keep lint quiet - at this point ngon_fi_count > 0
  j0 = 0;  // keep lint quiet - at this point ngon_fi_count > 0
  
  // find a boundary edge
  for ( ngon_fdex = 0; ngon_fdex < ngon_fi_count; ngon_fdex++ )
  {
    fi = ngon_fi[ngon_fdex];
    face_list.QuadFvi(fi,Fvi);
    for ( j0 = 0; j0 < 4; j0++ )
    {
      if ( Fvi[j0] == Fvi[(j0+1)%4] )
        continue;
      if ( 0 != ngon_nbr_map[ngon_fdex].m_NFS[j0] )
        continue; // has a neighbor or is part of a previously found boundary component when holes are allowed

      // we being at the vertex with index Fvi[j]
      break;
    }    
    if ( j0 < 4 )
      break;
  }
  
  if ( ngon_fdex >= ngon_fi_count )
    return 0;

  // max_vertex_count is used to prevent infinite recursion
  // when the mesh information is not valid or there is
  // a bug in this code.  The maximum value occurs
  // for a strip of quads.
  max_vertex_count = 2*ngon_fi_count + 2;


  // max_face_visit_count is used to prevent infinite recursion
  // when the mesh information is not valid or there is
  // a bug in this code.  The maximum value occurs
  // for a strip of quads when the initial face is
  // at the end of a strip.
  max_face_visit_count = 2*ngon_fi_count - 1;

  ngon_nbr_map[ngon_fdex].m_NFS[j0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
  if ( ngon_side )
    ngon_side->AppendNew() = EncodeNgonSide(ngon_fdex,j0,false);

  vi0 = Fvi[j0];
  j0 = (j0+1)%4;
  vi1 = Fvi[j0];
  if ( ngon_vi )
  {
    ngon_vi->Append(vi0);
    ngon_vi->Append(vi1);
  }
  for ( face_vist_count = 0;
        face_vist_count <= max_face_visit_count && ngon_boundary_index - ngon_boundary_index0 <= max_vertex_count;
        face_vist_count++ 
      )
  {
    for (j1 = 0; j1 < 4; j1++, j0 = next_j0 )
    {
      if ( 0 != ngon_nbr_map[ngon_fdex].m_NFS[j0] )
        break; // has a neighbor or is a boundary

      next_j0 = (j0+1)%4;
      if ( vi1 == Fvi[next_j0] )
        continue; // skip over duplicate vertex in triangles

      ngon_nbr_map[ngon_fdex].m_NFS[j0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
      if ( ngon_side )
        ngon_side->AppendNew() = EncodeNgonSide(ngon_fdex,j0,false);

      vi1 = Fvi[next_j0];
      if ( vi0 == vi1 )
      {
        // this is where successful searches end with (ngon_vi.Count() >= 3)
        if ( ngon_boundary_index - ngon_boundary_index0 >= 3 )
        {
          return ngon_boundary_index - ngon_boundary_index0;
        }
        return 0;
      }
      if ( ngon_vi )
        ngon_vi->Append(vi1);
    }

    if ( j1 >= 4 )
      break; // not expected - there is a bug or a bogus mesh

    if ( false == IsNFS_Neighbor(ngon_nbr_map[ngon_fdex].m_NFS[j0]) )
      break; // not expected - there is a bug or a bogus mesh

    // switch to neighbor face;
    nbr_ngon_fdex = (unsigned int)DecodeNFS_NgonFaceIndex(ngon_nbr_map[ngon_fdex].m_NFS[j0]);

    if ( nbr_ngon_fdex == ngon_fdex || nbr_ngon_fdex >= ngon_fi_count )
    {
      // Unexpected - bail rather than crash.
      // This means there is a bug in the code that 
      // set the values in the ngon_nbr_map[] array.
      // The same face may be visited multiple times (strip of quads for example),
      // but a face can never be its own neighbor.
      break;
    }

    // move onto the neighbor
    j0 = DecodeNFS_EdgeIndex(ngon_nbr_map[ngon_fdex].m_NFS[j0]);

    ngon_fdex = nbr_ngon_fdex;
    fi = ngon_fi[ngon_fdex];
    face_list.QuadFvi(fi,Fvi);
    // faces have compatible orientations 
    // (The shared edge is reversed when going to neighboring face)
    j0 = (j0+1)%4; // move the the vertex at the end of the shared edge

    if ( vi1 != Fvi[j0] )
    {
      // not expected - there is a bug or a bogus mesh
      break;
    }
  }

  return 0;
}